

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void P_CheckPlayerSprite(AActor *actor,int *spritenum,DVector2 *scale)

{
  double dVar1;
  uint uVar2;
  player_t *ppVar3;
  BYTE *pBVar4;
  FPlayerSkin *pFVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined4 extraout_var;
  int *piVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  
  ppVar3 = actor->player;
  puVar9 = (undefined8 *)
           ((long)&((ppVar3->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Nodes)->Next +
           (ulong)(((ppVar3->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                    Size - 1 & 0x1ea) * 0x18));
  do {
    puVar7 = puVar9;
    puVar9 = (undefined8 *)*puVar7;
  } while (*(int *)(puVar7 + 1) != 0x1ea);
  if ((*(int *)(puVar7[2] + 0x28) != 0) && (((actor->flags4).Value & 0x20) == 0)) {
    if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar6 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
      (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
    }
    pFVar5 = skins;
    pBVar4 = ((actor->super_DThinker).super_DObject.Class)->Defaults;
    dVar1 = *(double *)(pBVar4 + 0xe0);
    puVar9 = (undefined8 *)
             ((long)&((ppVar3->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((ppVar3->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1ea) * 0x18));
    puVar7 = puVar9;
    do {
      puVar10 = puVar7;
      puVar7 = (undefined8 *)*puVar10;
    } while (*(int *)(puVar10 + 1) != 0x1ea);
    scale->X = (skins[*(int *)(puVar10[2] + 0x28)].Scale.X / *(double *)(pBVar4 + 0xd8)) * scale->X;
    do {
      puVar7 = puVar9;
      puVar9 = (undefined8 *)*puVar7;
    } while (*(int *)(puVar7 + 1) != 0x1ea);
    scale->Y = (pFVar5[*(int *)(puVar7[2] + 0x28)].Scale.Y / dVar1) * scale->Y;
  }
  if (0.75 < ppVar3->crouchfactor || ppVar3->crouchfactor == 0.75) {
    return;
  }
  uVar2 = *spritenum;
  if ((uVar2 == actor->SpawnState->sprite) ||
     (uVar2 == *(uint *)&(ppVar3->mo->super_AActor).field_0x49c)) {
    piVar8 = (int *)&(ppVar3->mo->super_AActor).field_0x49c;
  }
  else {
    iVar6 = -1;
    if (((actor->flags4).Value & 0x20) != 0) goto LAB_0055942d;
    puVar9 = (undefined8 *)
             ((long)&((ppVar3->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((ppVar3->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1ea) * 0x18));
    puVar7 = puVar9;
    do {
      puVar10 = puVar7;
      puVar7 = (undefined8 *)*puVar10;
    } while (*(int *)(puVar10 + 1) != 0x1ea);
    puVar7 = puVar9;
    if (uVar2 != skins[*(int *)(puVar10[2] + 0x28)].sprite) {
      do {
        puVar10 = puVar7;
        puVar7 = (undefined8 *)*puVar10;
      } while (*(int *)(puVar10 + 1) != 0x1ea);
      if (uVar2 != skins[*(int *)(puVar10[2] + 0x28)].crouchsprite) goto LAB_0055942d;
    }
    do {
      puVar7 = puVar9;
      puVar9 = (undefined8 *)*puVar7;
    } while (*(int *)(puVar7 + 1) != 0x1ea);
    piVar8 = &skins[*(int *)(puVar7[2] + 0x28)].crouchsprite;
  }
  iVar6 = *piVar8;
LAB_0055942d:
  if (iVar6 < 1) {
    if (ppVar3->playerstate != '\x01') {
      scale->Y = scale->Y * 0.5;
    }
  }
  else {
    *spritenum = iVar6;
  }
  return;
}

Assistant:

void P_CheckPlayerSprite(AActor *actor, int &spritenum, DVector2 &scale)
{
	player_t *player = actor->player;
	int crouchspriteno;

	if (player->userinfo.GetSkin() != 0 && !(actor->flags4 & MF4_NOSKIN))
	{
		// Convert from default scale to skin scale.
		DVector2 defscale = actor->GetDefault()->Scale;
		scale.X *= skins[player->userinfo.GetSkin()].Scale.X / defscale.X;
		scale.Y *= skins[player->userinfo.GetSkin()].Scale.Y / defscale.Y;
	}

	// Set the crouch sprite?
	if (player->crouchfactor < 0.75)
	{
		if (spritenum == actor->SpawnState->sprite || spritenum == player->mo->crouchsprite) 
		{
			crouchspriteno = player->mo->crouchsprite;
		}
		else if (!(actor->flags4 & MF4_NOSKIN) &&
				(spritenum == skins[player->userinfo.GetSkin()].sprite ||
				 spritenum == skins[player->userinfo.GetSkin()].crouchsprite))
		{
			crouchspriteno = skins[player->userinfo.GetSkin()].crouchsprite;
		}
		else
		{ // no sprite -> squash the existing one
			crouchspriteno = -1;
		}

		if (crouchspriteno > 0) 
		{
			spritenum = crouchspriteno;
		}
		else if (player->playerstate != PST_DEAD && player->crouchfactor < 0.75)
		{
			scale.Y *= 0.5;
		}
	}
}